

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O0

Aig_Obj_t * Fra_ObjChild0Fra(Aig_Obj_t *pObj,int i)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_20;
  int i_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      local_20 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      pAVar2 = Fra_ObjFraig(pAVar2,i);
      iVar1 = Aig_ObjFaninC0(pObj);
      local_20 = Aig_NotCond(pAVar2,iVar1);
    }
    return local_20;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fra.h"
                ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t *  Fra_ObjChild0Fra( Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Fra_ObjFraig(Aig_ObjFanin0(pObj),i), Aig_ObjFaninC0(pObj)) : NULL;  }